

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall OneLevel_InsertFourthNode_Test::TestBody(OneLevel_InsertFourthNode_Test *this)

{
  bool bVar1;
  uint generation;
  type phVar2;
  char *pcVar3;
  pointer phVar4;
  Message *pMVar5;
  hash_type x;
  index_pointer *piVar6;
  char *in_R9;
  string local_718;
  AssertHelper local_6f8;
  Message local_6f0;
  allocator local_6e1;
  string local_6e0;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_698;
  Message local_690;
  address local_688;
  address local_680;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_660;
  Message local_658;
  uint local_650 [2];
  undefined1 local_648 [8];
  AssertionResult gtest_ar_3;
  Message local_630;
  uint local_624;
  hash_type local_620;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_2;
  internal_node *root_internal;
  index_pointer local_5f8;
  index_pointer root;
  AssertHelper local_5d0;
  Message local_5c8;
  allocator local_5b9;
  string local_5b8;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__1;
  Message local_578;
  size_t local_570;
  uint local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_530;
  Message local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_;
  Message local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar;
  string *key;
  string local_4e0;
  undefined1 local_4c0 [8];
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  itp;
  string local_3c0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_3a0;
  allocator local_2a1;
  string local_2a0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_280;
  allocator local_181;
  string local_180;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_160;
  unique_lock<mock_mutex> local_58;
  undefined1 local_48 [8];
  transaction_type t1;
  OneLevel_InsertFourthNode_Test *this_local;
  
  t1.lock_._8_8_ = this;
  std::unique_lock<mock_mutex>::unique_lock
            (&local_58,
             (mutex_type *)
             &(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_48,
          &(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_,&local_58);
  std::unique_lock<mock_mutex>::~unique_lock(&local_58);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_OneLevel).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"a",&local_181);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_160,phVar2,(transaction_type *)local_48,&local_180);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_OneLevel).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"b",&local_2a1);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_280,phVar2,(transaction_type *)local_48,&local_2a0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_OneLevel).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"c",(allocator *)&itp.field_0xf7);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_3a0,phVar2,(transaction_type *)local_48,&local_3c0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&itp.field_0xf7);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_OneLevel).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"d",(allocator *)((long)&key + 7));
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_4c0,phVar2,(transaction_type *)local_48,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&key + 7));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::iterator_base<false>::operator*((iterator_base<false> *)local_4c0);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_500,"\"d\"","key",(char (*) [2])0x2fc636,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x22d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_520,(bool *)&itp.first.pos_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_520,(AssertionResult *)"itp.second",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x22e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_564 = 4;
  phVar4 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_OneLevel).index_);
  local_570 = pstore::index::
              hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(phVar4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_560,"4U","index_->size ()",&local_564,&local_570);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x22f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_OneLevel).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"d",&local_5b9);
  local_591 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_5b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pMVar5 = testing::Message::operator<<
                       (&local_5c8,(char (*) [39])"key \"d\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&root.addr_,(internal *)local_590,
               (AssertionResult *)"this->is_found (*index_, \"d\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x230,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5d0,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    std::__cxx11::string::~string((string *)&root.addr_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  phVar4 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_OneLevel).index_);
  local_5f8 = pstore::index::
              hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::root(phVar4);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)this,local_5f8);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&local_5f8.addr_);
  local_620 = pstore::index::details::internal_node::get_bitmap
                        ((internal_node *)
                         gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_624 = 0x808a;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_618,"root_internal->get_bitmap ()","0b10000000\'10001010U",&local_620
             ,&local_624);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x236,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_630);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  local_650[1] = 4;
  x = pstore::index::details::internal_node::get_bitmap
                ((internal_node *)
                 gtest_ar_2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  local_650[0] = pstore::bit_count::pop_count(x);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_648,"4U",
             "pstore::bit_count::pop_count (root_internal->get_bitmap ())",local_650 + 1,local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x237,pcVar3);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,3);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         *)piVar6;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)this,
             (index_pointer)
             gtest_ar_4.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,3);
  local_680 = pstore::index::details::index_pointer::to_address((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,2);
  local_688 = pstore::index::details::index_pointer::to_address((index_pointer *)&piVar6->addr_);
  testing::internal::CmpHelperGT<pstore::address,pstore::address>
            ((internal *)local_678,"(*root_internal)[3].to_address ()",
             "(*root_internal)[2].to_address ()",&local_680,&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x239,pcVar3);
    testing::internal::AssertHelper::operator=(&local_698,&local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  phVar4 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_OneLevel).index_);
  generation = pstore::database::get_current_revision
                         (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(phVar4,(transaction_base *)local_48,generation);
  phVar4 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_OneLevel).index_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::root(phVar4);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)this,
             (index_pointer)
             gtest_ar__2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_OneLevel).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e0,"d",&local_6e1);
  local_6b9 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_6e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    pMVar5 = testing::Message::operator<<
                       (&local_6f0,(char (*) [39])"key \"d\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_718,(internal *)local_6b8,(AssertionResult *)"this->is_found (*index_, \"d\")"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x23c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6f8,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    std::__cxx11::string::~string((string *)&local_718);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
           *)local_4c0);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_48);
  return;
}

Assistant:

TEST_F (OneLevel, InsertFourthNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");

    // The node "d" is inserted into the internal heap node.
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "d");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("d", key);
    EXPECT_TRUE (itp.second);
    EXPECT_EQ (4U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "d")) << "key \"d\" should be present in the index";
    {
        // Check that the trie was laid out as we expected.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b10000000'10001010U);
        EXPECT_EQ (4U, pstore::bit_count::pop_count (root_internal->get_bitmap ()));
        this->check_is_leaf_node ((*root_internal)[3]);
        EXPECT_GT ((*root_internal)[3].to_address (), (*root_internal)[2].to_address ());
        index_->flush (t1, db_.get_current_revision ());
        this->check_is_store_internal_node (index_->root ());
        EXPECT_TRUE (this->is_found (*index_, "d")) << "key \"d\" should be present in the index";
    }
}